

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O1

_Bool chck_buffer_read_int(void *i,chck_bits bits,chck_buffer *buf)

{
  uint uVar1;
  ulong uVar2;
  size_t sVar3;
  _Bool _Var4;
  
  if ((i != (void *)0x0) && (buf != (chck_buffer *)0x0)) {
    _Var4 = false;
    if ((bits < (CHCK_BUFFER_B64|CHCK_BUFFER_B8)) &&
       (_Var4 = false, (0x116U >> (bits & 0x1f) & 1) != 0)) {
      sVar3 = chck_buffer_read(i,(ulong)bits,1,buf);
      if (sVar3 == 1) {
        _Var4 = true;
        if (buf->endianess != false) {
          if (bits == CHCK_BUFFER_B16) {
            *(ushort *)i = *i << 8 | *i >> 8;
          }
          else if (bits == CHCK_BUFFER_B64) {
            uVar2 = *i;
            *(ulong *)i = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                          (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                          (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
                          (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
          }
          else if (bits == CHCK_BUFFER_B32) {
            uVar1 = *i;
            *(uint *)i = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                         uVar1 << 0x18;
          }
          else if (CHCK_BUFFER_B8 < bits) {
            if (CHCK_BUFFER_B64 < bits) {
              __assert_fail("size <= sizeof(intmax_t)",
                            "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/endianess.h"
                            ,0x4c,"void chck_bswap_generic(void *, size_t)");
            }
            chck_buffer_read_int_cold_1();
          }
        }
      }
      else {
        _Var4 = false;
      }
    }
    return _Var4;
  }
  __assert_fail("i && buf",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/buffer.c"
                ,0x120,"_Bool chck_buffer_read_int(void *, enum chck_bits, struct chck_buffer *)");
}

Assistant:

bool
chck_buffer_read_int(void *i, enum chck_bits bits, struct chck_buffer *buf)
{
   assert(i && buf);

   if (!valid_bits(bits))
      return false;

   if (unlikely(chck_buffer_read(i, bits, 1, buf) != 1))
      return false;

   if (!chck_buffer_native_endianess(buf))
      chck_bswap_single(i, bits);

   return true;
}